

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

unique_ptr<char_*[],_std::default_delete<char_*[]>_> __thiscall
CommandReader::args(CommandReader *this)

{
  long lVar1;
  void *__s;
  undefined8 *puVar2;
  CommandReader *pCVar3;
  unique_ptr<char_*[],_std::default_delete<char_*[]>_> *empty;
  long in_RSI;
  long lVar4;
  ulong __n;
  
  if (*(char *)(in_RSI + 2) == '\0') {
    this->forced = false;
    this->escape = false;
    this->enclosed = false;
    this->field_0x3 = 0;
    this->state = STATE_NORMAL;
    pCVar3 = this;
  }
  else {
    lVar1 = *(long *)(in_RSI + 0x30) - *(long *)(in_RSI + 0x28) >> 5;
    __n = -(ulong)(lVar1 + 1U >> 0x3d != 0) | lVar1 * 8 + 8U;
    __s = operator_new__(__n);
    memset(__s,0,__n);
    *(void **)this = __s;
    puVar2 = *(undefined8 **)(in_RSI + 0x28);
    lVar1 = (long)*(undefined8 **)(in_RSI + 0x30) - (long)puVar2 >> 5;
    if (*(undefined8 **)(in_RSI + 0x30) != puVar2) {
      lVar4 = 0;
      do {
        *(undefined8 *)((long)__s + lVar4 * 8) = *puVar2;
        lVar4 = lVar4 + 1;
        puVar2 = puVar2 + 4;
      } while (lVar1 + (ulong)(lVar1 == 0) != lVar4);
    }
    pCVar3 = (CommandReader *)((long)__s + lVar1 * 8);
  }
  pCVar3->forced = false;
  pCVar3->escape = false;
  pCVar3->enclosed = false;
  pCVar3->field_0x3 = 0;
  pCVar3->state = STATE_NORMAL;
  return (__uniq_ptr_data<char_*,_std::default_delete<char_*[]>,_true,_true>)
         (__uniq_ptr_data<char_*,_std::default_delete<char_*[]>,_true,_true>)this;
}

Assistant:

std::unique_ptr<char *[]> args() const {
    // same
    if (!this->enclosed) {
      auto empty = std::unique_ptr<char *[]>();
      return empty;
    }

    auto args = std::make_unique<char *[]>(this->arguments.size() + 1);

    for (size_t i = 0; i < this->arguments.size(); i++) {
      args[i] = (char *)this->arguments[i].c_str();
    }

    args[this->arguments.size()] = nullptr;

    return args;
  }